

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O0

int verify_descriptor_pk(miniscript_node_t *node,miniscript_node_t *parent)

{
  int32_t iVar1;
  miniscript_node_t *parent_local;
  miniscript_node_t *node_local;
  
  iVar1 = get_child_list_count(node);
  if (((iVar1 == node->info->inner_num) && (node->child->info == (miniscript_item_t *)0x0)) &&
     ((node->child->kind & 0x20U) == 0x20)) {
    node->type_properties = node->info->type_properties;
    node_local._4_4_ = 0;
  }
  else {
    node_local._4_4_ = -2;
  }
  return node_local._4_4_;
}

Assistant:

static int verify_descriptor_pk(struct miniscript_node_t *node, struct miniscript_node_t *parent)
{
    (void)parent;
    if ((get_child_list_count(node) != node->info->inner_num) || node->child->info ||
        ((node->child->kind & DESCRIPTOR_KIND_KEY) != DESCRIPTOR_KIND_KEY))
        return WALLY_EINVAL;

    node->type_properties = node->info->type_properties;
    return WALLY_OK;
}